

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * createrawtransaction(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  _Manager_type in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffc78;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffcb8 [24];
  pointer in_stack_fffffffffffffcd0;
  RPCMethodImpl in_stack_fffffffffffffcd8;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"createrawtransaction",(allocator<char> *)&stack0xfffffffffffffce7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nCreate a transaction spending the given inputs and creating new outputs.\nOutputs can be addresses or data.\nReturns hex-encoded raw transaction.\nNote that the transaction\'s inputs are not signed, and\nit is not stored in the wallet or transmitted to the network.\n"
             ,(allocator<char> *)&stack0xfffffffffffffce6);
  CreateTxDoc();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"transaction",(allocator<char> *)&stack0xfffffffffffffcaf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"hex string of the transaction",(allocator<char> *)&stack0xfffffffffffffcae);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffc50;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc48;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc58;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffc60;
  description._M_string_length = in_stack_fffffffffffffc70;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc68;
  description.field_2 = in_stack_fffffffffffffc78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d8,STR_HEX,m_key_name,description,inner,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc50;
  result._0_8_ = in_stack_fffffffffffffc48;
  result.m_key_name._M_string_length = in_stack_fffffffffffffc58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc60;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffc68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffc78;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffca0;
  result.m_cond._M_string_length = in_stack_fffffffffffffcb8._0_8_;
  result.m_cond.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffcb8._8_16_;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffcb0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"createrawtransaction",(allocator<char> *)&stack0xfffffffffffffc87
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"address\\\":0.01}]\"",
             (allocator<char> *)&stack0xfffffffffffffc86);
  HelpExampleCli(&local_1b8,&local_1d8,&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"createrawtransaction",(allocator<char> *)&stack0xfffffffffffffc85
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\""
             ,(allocator<char> *)&stack0xfffffffffffffc84);
  HelpExampleCli(&local_218,&local_238,&local_258);
  std::operator+(&local_198,&local_1b8,&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"createrawtransaction",(allocator<char> *)&stack0xfffffffffffffc83
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"address\\\":0.01}]\"",
             (allocator<char> *)&stack0xfffffffffffffc82);
  HelpExampleRpc(&local_278,&local_298,&local_2b8);
  std::operator+(&local_178,&local_198,&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"createrawtransaction",(allocator<char> *)&stack0xfffffffffffffc81
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffce8,
             "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"data\\\":\\\"00010203\\\"}]\""
             ,(allocator<char> *)&stack0xfffffffffffffc80);
  HelpExampleRpc(&local_2d8,&local_2f8,(string *)&stack0xfffffffffffffce8);
  std::operator+(&local_158,&local_178,&local_2d8);
  local_138 = local_128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == &local_158.field_2) {
    uStack_120 = local_158.field_2._8_8_;
  }
  else {
    local_138 = local_158._M_dataplus._M_p;
  }
  local_130 = local_158._M_string_length;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:449:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/rawtransaction.cpp:449:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffc78;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffcd0;
  examples.m_examples._0_24_ = in_stack_fffffffffffffcb8;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffc50,&stack0xfffffffffffffc58)),
             description_00,args,(RPCResults)in_stack_fffffffffffffca0,examples,
             in_stack_fffffffffffffcd8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc58);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffce8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffcb0);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc88);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffcc8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createrawtransaction()
{
    return RPCHelpMan{"createrawtransaction",
                "\nCreate a transaction spending the given inputs and creating new outputs.\n"
                "Outputs can be addresses or data.\n"
                "Returns hex-encoded raw transaction.\n"
                "Note that the transaction's inputs are not signed, and\n"
                "it is not stored in the wallet or transmitted to the network.\n",
                CreateTxDoc(),
                RPCResult{
                    RPCResult::Type::STR_HEX, "transaction", "hex string of the transaction"
                },
                RPCExamples{
                    HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"address\\\":0.01}]\"")
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
            + HelpExampleRpc("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"address\\\":0.01}]\"")
            + HelpExampleRpc("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::optional<bool> rbf;
    if (!request.params[3].isNull()) {
        rbf = request.params[3].get_bool();
    }
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);

    return EncodeHexTx(CTransaction(rawTx));
},
    };
}